

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_189e5e5::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pcVar1;
  size_type sVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  bool bVar5;
  int iVar6;
  ArrayIndex AVar7;
  ArrayIndex AVar8;
  ValueType VVar9;
  string *name;
  string *psVar10;
  string *psVar11;
  Value *this_00;
  Value *pVVar12;
  undefined8 uVar13;
  runtime_error *prVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  Value *value;
  size_type __rlen;
  size_type __rlen_7;
  undefined8 uVar16;
  Args path;
  string_view value_00;
  Args path_00;
  Args path_01;
  string_view value_01;
  Args path_02;
  string_view value_02;
  Args path_03;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  Args path_04;
  string_view value_06;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view sVar17;
  const_iterator cVar18;
  Args args;
  Value json2;
  Value json;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [2];
  string *local_b8;
  ValueHolder local_b0;
  char *local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  char *local_60;
  undefined1 local_58 [24];
  undefined8 local_40;
  
  this = status->Makefile;
  _Var15._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_100._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar17._M_str = "missing out-var argument";
  sVar17._M_len = 0x18;
  _Stack_f8._M_current = _Var15._M_current;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_100,sVar17);
  if (((local_100._M_current == _Stack_f8._M_current) ||
      (((string_view *)((long)local_100._M_current + 8))->_M_len != 0xe)) ||
     (iVar6 = bcmp(*(void **)local_100._M_current,"ERROR_VARIABLE",0xe), iVar6 != 0)) {
    psVar10 = (string *)0x0;
  }
  else {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&local_100,(string_view)(ZEXT816(0x923ff5) << 0x40));
    error_03._M_str = "missing error-var argument";
    error_03._M_len = 0x1a;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_100,error_03);
    value_01._M_str = "NOTFOUND";
    value_01._M_len = 8;
    _Var15._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8ab3c3;
    cmMakefile::AddDefinition(this,psVar10,value_01);
  }
  error._M_str = "missing mode argument";
  error._M_len = 0x15;
  local_b8 = psVar10;
  psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_100,error);
  pcVar1 = (psVar10->_M_dataplus)._M_p;
  sVar2 = psVar10->_M_string_length;
  if (((((sVar2 != 3) || (iVar6 = bcmp(pcVar1,"GET",3), iVar6 != 0)) &&
       ((sVar2 != 4 || (iVar6 = bcmp(pcVar1,"TYPE",4), iVar6 != 0)))) &&
      ((sVar2 != 6 ||
       (((iVar6 = bcmp(pcVar1,"MEMBER",6), iVar6 != 0 &&
         (iVar6 = bcmp(pcVar1,"LENGTH",6), iVar6 != 0)) &&
        (iVar6 = bcmp(pcVar1,"REMOVE",6), iVar6 != 0)))))) &&
     (((sVar2 != 3 || (iVar6 = bcmp(pcVar1,"SET",3), iVar6 != 0)) &&
      ((sVar2 != 5 || (iVar6 = bcmp(pcVar1,"EQUAL",5), iVar6 != 0)))))) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_68 = (undefined1  [8])0x15;
    local_60 = "got an invalid mode \'";
    local_b0.int_ = 0x41;
    local_a8 = "\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL";
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              ((string *)&local_f0,(static_string_view *)local_68,psVar10,
               (static_string_view *)&local_b0);
    std::runtime_error::runtime_error(prVar14,(string *)local_f0._M_local_buf);
    *(undefined ***)prVar14 = &PTR__runtime_error_00b3f388;
    prVar14[0x20] = (runtime_error)0x0;
    __cxa_throw(prVar14,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  error_00._M_str = "missing json string argument";
  error_00._M_len = 0x1c;
  psVar11 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_100,error_00);
  ReadJson((Value *)&local_b0,psVar11);
  pcVar1 = (psVar10->_M_dataplus)._M_p;
  sVar2 = psVar10->_M_string_length;
  if ((sVar2 == 3) && (iVar6 = bcmp(pcVar1,"GET",3), iVar6 == 0)) {
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var15._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current = _Stack_f8._M_current;
    this_00 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                          (Value *)local_100._M_current,path);
    bVar5 = Json::Value::isObject(this_00);
    pVVar12 = extraout_RDX;
    if ((bVar5) || (bVar5 = Json::Value::isArray(this_00), pVVar12 = extraout_RDX_00, bVar5)) {
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&local_f0,(_anonymous_namespace_ *)this_00,pVVar12);
      value_00._M_str = (char *)local_f0._M_allocated_capacity;
      value_00._M_len = local_f0._8_8_;
      cmMakefile::AddDefinition(this,name,value_00);
    }
    else {
      bVar5 = Json::Value::isBool(this_00);
      if (bVar5) {
        bVar5 = Json::Value::asBool(this_00);
        cmMakefile::AddDefinitionBool(this,name,bVar5);
        goto LAB_004420d1;
      }
      Json::Value::asString_abi_cxx11_((String *)&local_f0,this_00);
      value_04._M_str = (char *)local_f0._M_allocated_capacity;
      value_04._M_len = local_f0._8_8_;
      cmMakefile::AddDefinition(this,name,value_04);
    }
  }
  else {
    if ((sVar2 == 4) && (iVar6 = bcmp(pcVar1,"TYPE",4), iVar6 == 0)) {
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var15._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f8._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                            (Value *)local_100._M_current,path_00);
      VVar9 = Json::Value::type(pVVar12);
      sVar17 = JsonTypeToString(VVar9);
      cmMakefile::AddDefinition(this,name,sVar17);
      goto LAB_004420d1;
    }
    if (sVar2 != 6) {
LAB_00441c12:
      if ((sVar2 == 3) && (iVar6 = bcmp(pcVar1,"SET",3), iVar6 == 0)) {
        error_04._M_str = "missing new value remove";
        error_04._M_len = 0x18;
        psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_100,error_04);
        error_05._M_str = "missing member name to add";
        error_05._M_len = 0x1a;
        psVar11 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_100,error_05);
        _Var4._M_current = _Stack_f8._M_current;
        _Var3._M_current = local_100._M_current;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var15._M_current;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_f8._M_current;
        pVVar12 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                              (Value *)local_100._M_current,path_02);
        ReadJson((Value *)&local_f0,psVar10);
        bVar5 = Json::Value::isObject(pVVar12);
        if (bVar5) {
          pVVar12 = Json::Value::operator[](pVVar12,psVar11);
          Json::Value::operator=(pVVar12,(Value *)&local_f0);
          pVVar12 = extraout_RDX_01;
        }
        else {
          bVar5 = Json::Value::isArray(pVVar12);
          if (!bVar5) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
            VVar9 = Json::Value::type(pVVar12);
            local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
            local_68 = (undefined1  [8])0x44;
            local_60 = "SET needs to be called with an element of type OBJECT or ARRAY, got ";
            local_58._0_8_ = 0;
            local_40 = 0;
            views_00._M_len = 2;
            views_00._M_array = (iterator)local_68;
            cmCatViews((string *)local_88,views_00);
            std::runtime_error::runtime_error(prVar14,(string *)local_88);
            *(undefined ***)prVar14 = &PTR__runtime_error_00b3f388;
            prVar14[0x20] = (runtime_error)0x0;
            __cxa_throw(prVar14,&(anonymous_namespace)::json_error::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          local_60 = (char *)(_Var4._M_current + 1);
          local_68 = (undefined1  [8])_Var3._M_current;
          local_58[0] = 1;
          AVar7 = ParseIndex(psVar11,(optional<(anonymous_namespace)::Args> *)local_68,0xffffffff);
          bVar5 = Json::Value::isValidIndex(pVVar12,AVar7);
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar12,AVar7);
            Json::Value::operator=(pVVar12,(Value *)&local_f0);
            pVVar12 = extraout_RDX_02;
          }
          else {
            Json::Value::append(pVVar12,(Value *)&local_f0);
            pVVar12 = extraout_RDX_03;
          }
        }
        (anonymous_namespace)::WriteJson_abi_cxx11_
                  ((string *)local_68,(_anonymous_namespace_ *)&local_b0.bool_,pVVar12);
        value_05._M_str = (char *)local_68;
        value_05._M_len = (size_t)local_60;
        cmMakefile::AddDefinition(this,name,value_05);
        if (local_68 != (undefined1  [8])local_58) {
          operator_delete((void *)local_68,local_58._0_8_ + 1);
        }
      }
      else {
        if ((sVar2 != 5) || (iVar6 = bcmp(pcVar1,"EQUAL",5), iVar6 != 0)) goto LAB_004420d1;
        error_01._M_str = "missing second json string argument";
        error_01._M_len = 0x23;
        psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_100,error_01);
        ReadJson((Value *)&local_f0,psVar10);
        bVar5 = Json::Value::operator==((Value *)&local_b0,(Value *)&local_f0);
        cmMakefile::AddDefinitionBool(this,name,bVar5);
      }
      Json::Value::~Value((Value *)&local_f0);
      goto LAB_004420d1;
    }
    iVar6 = bcmp(pcVar1,"MEMBER",6);
    if (iVar6 == 0) {
      error_02._M_str = "missing member index";
      error_02._M_len = 0x14;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_100,error_02);
      _Var4._M_current = _Stack_f8._M_current;
      _Var3._M_current = local_100._M_current;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var15._M_current;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f8._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                            (Value *)local_100._M_current,path_01);
      bVar5 = Json::Value::isObject(pVVar12);
      if (!bVar5) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
        VVar9 = Json::Value::type(pVVar12);
        local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
        local_68 = (undefined1  [8])0x3e;
        local_60 = "MEMBER needs to be called with an element of type OBJECT, got ";
        local_58._0_8_ = 0;
        local_40 = 0;
        views._M_len = 2;
        views._M_array = (iterator)local_68;
        cmCatViews((string *)&local_f0,views);
        std::runtime_error::runtime_error(prVar14,(string *)local_f0._M_local_buf);
        *(undefined ***)prVar14 = &PTR__runtime_error_00b3f388;
        *(undefined4 *)(prVar14 + 0x10) = local_100._M_current._0_4_;
        *(undefined4 *)(prVar14 + 0x14) = local_100._M_current._4_4_;
        *(undefined4 *)(prVar14 + 0x18) = _Stack_f8._M_current._0_4_;
        *(undefined4 *)(prVar14 + 0x1c) = _Stack_f8._M_current._4_4_;
        prVar14[0x20] = (runtime_error)0x1;
        __cxa_throw(prVar14,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_f0._8_8_ = _Var4._M_current + 1;
      local_f0._M_allocated_capacity = (size_type)_Var3._M_current;
      local_e0[0]._M_local_buf[0] = '\x01';
      AVar8 = Json::Value::size(pVVar12);
      iVar6 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)&local_f0,AVar8);
      cVar18 = Json::Value::begin(pVVar12);
      local_68 = (undefined1  [8])cVar18.super_ValueIteratorBase.current_._M_node;
      local_60 = (char *)CONCAT71(local_60._1_7_,cVar18.super_ValueIteratorBase.isNull_);
      if (iVar6 < 1) {
        if (iVar6 != 0) {
          do {
            Json::ValueIteratorBase::decrement((ValueIteratorBase *)local_68);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0);
        }
      }
      else {
        do {
          Json::ValueIteratorBase::increment((ValueIteratorBase *)local_68);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      local_88._0_8_ = local_68;
      local_88[8] = (bool)local_60._0_1_;
      Json::ValueIteratorBase::name_abi_cxx11_((String *)&local_f0,(ValueIteratorBase *)local_88);
      value_02._M_str = (char *)local_f0._M_allocated_capacity;
      value_02._M_len = local_f0._8_8_;
      cmMakefile::AddDefinition(this,name,value_02);
    }
    else {
      iVar6 = bcmp(pcVar1,"LENGTH",6);
      if (iVar6 == 0) {
        path_03.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var15._M_current;
        path_03.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_f8._M_current;
        pVVar12 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                              (Value *)local_100._M_current,path_03);
        bVar5 = Json::Value::isArray(pVVar12);
        if ((!bVar5) && (bVar5 = Json::Value::isObject(pVVar12), !bVar5)) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
          VVar9 = Json::Value::type(pVVar12);
          local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
          local_68 = (undefined1  [8])0x47;
          local_60 = "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          local_58._0_8_ = 0;
          local_40 = 0;
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_68;
          cmCatViews((string *)&local_f0,views_01);
          std::runtime_error::runtime_error(prVar14,(string *)local_f0._M_local_buf);
          *(undefined ***)prVar14 = &PTR__runtime_error_00b3f388;
          *(undefined4 *)(prVar14 + 0x10) = local_100._M_current._0_4_;
          *(undefined4 *)(prVar14 + 0x14) = local_100._M_current._4_4_;
          *(undefined4 *)(prVar14 + 0x18) = _Stack_f8._M_current._0_4_;
          *(undefined4 *)(prVar14 + 0x1c) = _Stack_f8._M_current._4_4_;
          prVar14[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar14,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar8 = Json::Value::size(pVVar12);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_f0,AVar8);
        uVar13 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar13 = local_f0._M_allocated_capacity;
        }
        uVar16 = &local_f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar16 = local_f0._M_allocated_capacity;
        }
        value_03._M_str = *(char **)uVar13;
        value_03._M_len = ((string_view *)(uVar16 + 8))->_M_len;
        cmMakefile::AddDefinition(this,name,value_03);
        goto LAB_004420d1;
      }
      iVar6 = bcmp(pcVar1,"REMOVE",6);
      if (iVar6 != 0) goto LAB_00441c12;
      error_06._M_str = "missing member or index to remove";
      error_06._M_len = 0x21;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_100,error_06);
      _Var4._M_current = _Stack_f8._M_current;
      _Var3._M_current = local_100._M_current;
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var15._M_current;
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f8._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_189e5e5 *)&local_b0.bool_,
                            (Value *)local_100._M_current,path_04);
      bVar5 = Json::Value::isArray(pVVar12);
      if (bVar5) {
        local_f0._8_8_ = _Var4._M_current + 1;
        local_f0._M_allocated_capacity = (size_type)_Var3._M_current;
        local_e0[0]._M_local_buf[0] = '\x01';
        AVar8 = Json::Value::size(pVVar12);
        AVar7 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)&local_f0,AVar8);
        Json::Value::Value((Value *)&local_f0,nullValue);
        Json::Value::removeIndex(pVVar12,AVar7,(Value *)&local_f0);
      }
      else {
        bVar5 = Json::Value::isObject(pVVar12);
        if (!bVar5) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
          VVar9 = Json::Value::type(pVVar12);
          local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
          local_68 = (undefined1  [8])0x47;
          local_60 = "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          local_58._0_8_ = 0;
          local_40 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_68;
          cmCatViews((string *)&local_f0,views_02);
          std::runtime_error::runtime_error(prVar14,(string *)local_f0._M_local_buf);
          *(undefined ***)prVar14 = &PTR__runtime_error_00b3f388;
          *(undefined4 *)(prVar14 + 0x10) = local_100._M_current._0_4_;
          *(undefined4 *)(prVar14 + 0x14) = local_100._M_current._4_4_;
          *(undefined4 *)(prVar14 + 0x18) = _Stack_f8._M_current._0_4_;
          *(undefined4 *)(prVar14 + 0x1c) = _Stack_f8._M_current._4_4_;
          prVar14[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar14,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)&local_f0,nullValue);
        Json::Value::removeMember(pVVar12,psVar10,(Value *)&local_f0);
      }
      Json::Value::~Value((Value *)&local_f0);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&local_f0,(_anonymous_namespace_ *)&local_b0.bool_,value);
      value_06._M_str = (char *)local_f0._M_allocated_capacity;
      value_06._M_len = local_f0._8_8_;
      cmMakefile::AddDefinition(this,name,value_06);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_allocated_capacity != local_e0) {
    operator_delete((void *)local_f0._M_allocated_capacity,
                    CONCAT71(local_e0[0]._M_allocated_capacity._1_7_,local_e0[0]._M_local_buf[0]) +
                    1);
  }
LAB_004420d1:
  Json::Value::~Value((Value *)&local_b0);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        cmStrCat("got an invalid mode '"_s, mode,
                 "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
                 " EQUAL"_s));
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error(
          cmStrCat("MEMBER needs to be called with an element of "
                   "type OBJECT, got "_s,
                   JsonTypeToString(value.type())),
          args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error(cmStrCat("LENGTH needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error(cmStrCat("REMOVE needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error(cmStrCat("SET needs to be called with an "
                                  "element of type OBJECT or ARRAY, got "_s,
                                  JsonTypeToString(value.type())));
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmStrCat(errorPath, "-NOTFOUND"_s));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmStrCat("sub-command JSON "_s, e.what(), "."_s));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}